

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_logging.c
# Opt level: O2

int oonf_log_init(oonf_appdata *data,oonf_log_severity def_severity)

{
  int iVar1;
  oonf_log_severity oVar2;
  size_t sVar3;
  byte bVar4;
  uint uVar5;
  byte bVar6;
  ulong uVar7;
  long lVar8;
  undefined1 auVar9 [16];
  
  _appdata = data;
  _libdata = oonf_libdata_get();
  _source_count = 6;
  _handler_list.prev = &_handler_list;
  _handler_list.next = &_handler_list;
  iVar1 = abuf_init(&_logbuffer);
  if (iVar1 == 0) {
    _max_severitytext_len = 0;
    uVar7 = 0;
    for (uVar5 = 1; uVar5 < 9; uVar5 = uVar5 * 2) {
      sVar3 = strlen(LOG_SEVERITY_NAMES[uVar5]);
      if (uVar7 < sVar3) {
        uVar7 = sVar3;
        _max_severitytext_len = sVar3;
      }
    }
    _max_sourcetext_len = 0;
    uVar7 = 0;
    for (lVar8 = 0; lVar8 != 0x30; lVar8 = lVar8 + 8) {
      sVar3 = strlen(*(char **)((long)LOG_SOURCE_NAMES + lVar8));
      if (uVar7 < sVar3) {
        uVar7 = sVar3;
        _max_sourcetext_len = sVar3;
      }
    }
    bVar4 = 0;
    for (oVar2 = LOG_SEVERITY_DEBUG; oVar2 < (LOG_SEVERITY_ASSERT|LOG_SEVERITY_DEBUG);
        oVar2 = oVar2 * 2) {
      bVar6 = (byte)oVar2;
      if (oVar2 < def_severity) {
        bVar6 = 0;
      }
      bVar4 = bVar4 | bVar6;
    }
    auVar9 = pshuflw(ZEXT216(CONCAT11(bVar4,bVar4)),ZEXT216(CONCAT11(bVar4,bVar4)),0);
    log_global_mask._0_4_ = auVar9._0_4_;
    iVar1 = 0;
    log_global_mask._4_4_ = log_global_mask._0_4_;
    log_global_mask._8_4_ = log_global_mask._0_4_;
    log_global_mask._12_4_ = log_global_mask._0_4_;
    log_global_mask._16_4_ = log_global_mask._0_4_;
    log_global_mask._20_4_ = log_global_mask._0_4_;
    log_global_mask._24_4_ = log_global_mask._0_4_;
    log_global_mask._28_4_ = log_global_mask._0_4_;
    log_global_mask._32_4_ = log_global_mask._0_4_;
    log_global_mask._36_4_ = log_global_mask._0_4_;
    log_global_mask._40_4_ = log_global_mask._0_4_;
    log_global_mask._44_4_ = log_global_mask._0_4_;
    log_global_mask._48_4_ = log_global_mask._0_4_;
    log_global_mask._52_4_ = log_global_mask._0_4_;
    log_global_mask._56_4_ = log_global_mask._0_4_;
    log_global_mask._60_4_ = log_global_mask._0_4_;
    log_global_mask._64_4_ = log_global_mask._0_4_;
    log_global_mask._68_4_ = log_global_mask._0_4_;
    log_global_mask._72_4_ = log_global_mask._0_4_;
    log_global_mask._76_4_ = log_global_mask._0_4_;
    log_global_mask._80_4_ = log_global_mask._0_4_;
    log_global_mask._84_4_ = log_global_mask._0_4_;
    log_global_mask._88_4_ = log_global_mask._0_4_;
    log_global_mask._92_4_ = log_global_mask._0_4_;
    log_global_mask._96_4_ = log_global_mask._0_4_;
    log_global_mask._100_4_ = log_global_mask._0_4_;
    log_global_mask._104_4_ = log_global_mask._0_4_;
    log_global_mask._108_4_ = log_global_mask._0_4_;
    log_global_mask._112_4_ = log_global_mask._0_4_;
    log_global_mask._116_4_ = log_global_mask._0_4_;
    log_global_mask._120_4_ = log_global_mask._0_4_;
    log_global_mask._124_4_ = log_global_mask._0_4_;
    memset(_log_warnings,0,0x200);
  }
  else {
    fputs("Not enough memory for logging buffer\n",_stderr);
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int
oonf_log_init(const struct oonf_appdata *data, enum oonf_log_severity def_severity) {
  enum oonf_log_severity sev;
  enum oonf_log_source src;
  size_t len;

  _appdata = data;
  _libdata = oonf_libdata_get();
  _source_count = LOG_CORESOURCE_COUNT;

  list_init_head(&_handler_list);

  if (abuf_init(&_logbuffer)) {
    fputs("Not enough memory for logging buffer\n", stderr);
    return -1;
  }

  /* initialize maximum severity length */
  _max_severitytext_len = 0;
  OONF_FOR_ALL_LOGSEVERITIES(sev) {
    len = strlen(LOG_SEVERITY_NAMES[sev]);
    if (len > _max_severitytext_len) {
      _max_severitytext_len = len;
    }
  }

  /* initialize maximum source length */
  _max_sourcetext_len = 0;
  for (src = 0; src < LOG_CORESOURCE_COUNT; src++) {
    len = strlen(LOG_SOURCE_NAMES[src]);
    if (len > _max_sourcetext_len) {
      _max_sourcetext_len = len;
    }
  }

  /* set default mask */
  _default_mask = 0;
  OONF_FOR_ALL_LOGSEVERITIES(sev) {
    if (sev >= def_severity) {
      _default_mask |= sev;
    }
  }

  /* clear global mask */
  memset(&log_global_mask, _default_mask, sizeof(log_global_mask));

  /* clear warning counter */
  memset(_log_warnings, 0, sizeof(_log_warnings));
  return 0;
}